

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddCheck.c
# Opt level: O0

int cuddHeapProfile(DdManager *dd)

{
  DdSubtable *pDVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  uint local_40;
  uint local_3c;
  int nonempty;
  int maxnodes;
  int largest;
  int retval;
  int nodes;
  int i;
  DdSubtable *subtables;
  int ntables;
  DdManager *dd_local;
  
  iVar4 = dd->size;
  pDVar1 = dd->subtables;
  nonempty = -1;
  local_3c = 0xffffffff;
  local_40 = 0;
  iVar2 = fprintf((FILE *)dd->out,"*** DD heap profile for 0x%lx ***\n",dd);
  if (iVar2 == -1) {
    dd_local._4_4_ = 0;
  }
  else {
    for (retval = 0; retval < iVar4; retval = retval + 1) {
      uVar3 = pDVar1[retval].keys - pDVar1[retval].dead;
      if (uVar3 != 0) {
        local_40 = local_40 + 1;
        iVar2 = fprintf((FILE *)dd->out,"%5d: %5d nodes\n",(ulong)(uint)retval,(ulong)uVar3);
        if (iVar2 == -1) {
          return 0;
        }
        if ((int)local_3c < (int)uVar3) {
          nonempty = retval;
          local_3c = uVar3;
        }
      }
    }
    uVar3 = (dd->constants).keys - (dd->constants).dead;
    if (uVar3 != 0) {
      local_40 = local_40 + 1;
      iVar2 = fprintf((FILE *)dd->out,"const: %5d nodes\n",(ulong)uVar3);
      if (iVar2 == -1) {
        return 0;
      }
      if ((int)local_3c < (int)uVar3) {
        nonempty = 0x7fffffff;
        local_3c = uVar3;
      }
    }
    iVar4 = fprintf((FILE *)dd->out,"Summary: %d tables, %d non-empty, largest: %d ",
                    (ulong)(iVar4 + 1),(ulong)local_40,(ulong)(uint)nonempty);
    if (iVar4 == -1) {
      dd_local._4_4_ = 0;
    }
    else {
      iVar4 = fprintf((FILE *)dd->out,"(with %d nodes)\n",(ulong)local_3c);
      if (iVar4 == -1) {
        dd_local._4_4_ = 0;
      }
      else {
        dd_local._4_4_ = 1;
      }
    }
  }
  return dd_local._4_4_;
}

Assistant:

int
cuddHeapProfile(
  DdManager * dd)
{
    int ntables = dd->size;
    DdSubtable *subtables = dd->subtables;
    int i,              /* loop index */
        nodes,          /* live nodes in i-th layer */
        retval,         /* return value of fprintf */
        largest = -1,   /* index of the table with most live nodes */
        maxnodes = -1,  /* maximum number of live nodes in a table */
        nonempty = 0;   /* number of tables with live nodes */

    /* Print header. */
#if SIZEOF_VOID_P == 8
    retval = fprintf(dd->out,"*** DD heap profile for 0x%lx ***\n",
                     (ptruint) dd);
#else
    retval = fprintf(dd->out,"*** DD heap profile for 0x%x ***\n",
                     (ptruint) dd);
#endif
    if (retval == EOF) return 0;

    /* Print number of live nodes for each nonempty table. */
    for (i=0; i<ntables; i++) {
        nodes = subtables[i].keys - subtables[i].dead;
        if (nodes) {
            nonempty++;
            retval = fprintf(dd->out,"%5d: %5d nodes\n", i, nodes);
            if (retval == EOF) return 0;
            if (nodes > maxnodes) {
                maxnodes = nodes;
                largest = i;
            }
        }
    }

    nodes = dd->constants.keys - dd->constants.dead;
    if (nodes) {
        nonempty++;
        retval = fprintf(dd->out,"const: %5d nodes\n", nodes);
        if (retval == EOF) return 0;
        if (nodes > maxnodes) {
            maxnodes = nodes;
            largest = CUDD_CONST_INDEX;
        }
    }

    /* Print summary. */
    retval = fprintf(dd->out,"Summary: %d tables, %d non-empty, largest: %d ",
          ntables+1, nonempty, largest);
    if (retval == EOF) return 0;
    retval = fprintf(dd->out,"(with %d nodes)\n", maxnodes);
    if (retval == EOF) return 0;

    return(1);

}